

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O2

R2Rect * R2Rect::FromCenterSize(R2Rect *__return_storage_ptr__,R2Point *center,R2Point *size)

{
  R1Interval local_28;
  R1Interval local_18;
  
  local_18.bounds_.c_[1] = size->c_[0] * 0.5;
  local_18.bounds_.c_[0] = center->c_[0] - local_18.bounds_.c_[1];
  local_18.bounds_.c_[1] = local_18.bounds_.c_[1] + center->c_[0];
  local_28.bounds_.c_[1] = size->c_[1] * 0.5;
  local_28.bounds_.c_[0] = center->c_[1] - local_28.bounds_.c_[1];
  local_28.bounds_.c_[1] = local_28.bounds_.c_[1] + center->c_[1];
  R2Rect(__return_storage_ptr__,&local_18,&local_28);
  return __return_storage_ptr__;
}

Assistant:

R2Rect R2Rect::FromCenterSize(const R2Point& center, const R2Point& size) {
  return R2Rect(R1Interval(center.x() - 0.5 * size.x(),
                           center.x() + 0.5 * size.x()),
                R1Interval(center.y() - 0.5 * size.y(),
                           center.y() + 0.5 * size.y()));
}